

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubdirectoryDisposer.cpp
# Opt level: O1

void __thiscall
ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(SubdirectoryDisposer *this)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = (string *)ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::_M_assign(psVar2);
  pcVar1 = (this->previous_result)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->previous_result).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

SubdirectoryDisposer::~SubdirectoryDisposer()
    {
        ApprovalTestNamer::testConfiguration().subdirectory = previous_result;
    }